

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::is_color_terminal(void)

{
  anon_class_8_1_a7dcfcbe_for__M_pred __pred;
  int iVar1;
  char *pcVar2;
  const_iterator __first;
  char *env_p;
  array<const_char_*,_14UL> *__last;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  pcVar2 = ::getenv("TERM");
  if (pcVar2 == (char *)0x0) {
    local_1 = false;
  }
  else {
    if (is_color_terminal()::result == '\0') {
      iVar1 = __cxa_guard_acquire(&is_color_terminal()::result);
      if (iVar1 != 0) {
        __last = &is_color_terminal::terms;
        __first = std::array<const_char_*,_14UL>::begin((array<const_char_*,_14UL> *)0x10fda2);
        std::array<const_char_*,_14UL>::end((array<const_char_*,_14UL> *)0x10fdb1);
        __pred.env_p._7_1_ = in_stack_ffffffffffffffe7;
        __pred.env_p._0_7_ = in_stack_ffffffffffffffe0;
        is_color_terminal::result =
             std::any_of<char_const*const*,spdlog::details::os::is_color_terminal()::__0>
                       (__first,__last->_M_elems,__pred);
        __cxa_guard_release(&is_color_terminal()::result);
      }
    }
    local_1 = (bool)(is_color_terminal::result & 1);
  }
  return local_1;
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr std::array<const char *, 14> terms = {
        {"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"}};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(terms.begin(), terms.end(), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}